

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  string *__range2;
  ulong uVar7;
  undefined8 uVar8;
  size_type sVar9;
  char cVar10;
  ulong *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  int local_b4;
  ulong *local_b0;
  size_type local_a8;
  ulong local_a0 [2];
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_b4 = number;
  if (number == 0) {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_d8 = &local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_70,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_a0[0] = local_c8;
    puVar11 = local_d8;
    if (local_d8 == &local_c8) goto LAB_0011503f;
  }
  else {
    pcVar2 = (base_name->pathname_)._M_dataplus._M_p;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    StreamableToString<int>(&local_50,&local_b4);
    uVar7 = 0xf;
    if (local_b0 != local_a0) {
      uVar7 = local_a0[0];
    }
    if (uVar7 < local_50._M_string_length + local_a8) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar8 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_50._M_string_length + local_a8) goto LAB_00114dda;
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_50,0,0,(char *)local_b0,local_a8);
    }
    else {
LAB_00114dda:
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
    }
    local_90 = &local_80;
    psVar5 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar1 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5 == paVar1) {
      local_80 = paVar1->_M_allocated_capacity;
      uStack_78 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    }
    else {
      local_80 = paVar1->_M_allocated_capacity;
      local_90 = psVar5;
    }
    local_88 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar3->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar11 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar11) {
      local_c8 = *puVar11;
      lStack_c0 = plVar4[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar11;
      local_d8 = (ulong *)*plVar4;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)puVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_70,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    puVar11 = local_b0;
    if (local_b0 == local_a0) goto LAB_0011503f;
  }
  operator_delete(puVar11,local_a0[0] + 1);
LAB_0011503f:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  _Var6._M_p = local_f8._M_dataplus._M_p;
  if (local_f8._M_string_length != 0) {
    sVar9 = 0;
    do {
      cVar10 = local_f8._M_dataplus._M_p[sVar9];
      if (((cVar10 != '/') || (cVar10 = '/', _Var6._M_p == local_f8._M_dataplus._M_p)) ||
         (_Var6._M_p[-1] != '/')) {
        *_Var6._M_p = cVar10;
        _Var6._M_p = _Var6._M_p + 1;
      }
      sVar9 = sVar9 + 1;
    } while (local_f8._M_string_length != sVar9);
  }
  local_f8._M_string_length = (long)_Var6._M_p - (long)local_f8._M_dataplus._M_p;
  *_Var6._M_p = '\0';
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}